

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *
makeSample(vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *__return_storage_ptr__,
          u8 *sampleBuf,u8 **strIn,size_t *lenIn,size_t nlines,
          unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *sample_len_out)

{
  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *p_Var1;
  size_t i;
  size_t sVar2;
  pointer __p;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  size_t len;
  u8 *sampleBuf_local;
  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_40;
  u8 *local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  for (sVar2 = 0; nlines != sVar2; sVar2 = sVar2 + 1) {
    uVar3 = uVar3 + lenIn[sVar2];
  }
  sampleBuf_local = sampleBuf;
  local_40 = (__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)sample_len_out;
  if (uVar3 < 0x4000) {
    while (bVar6 = nlines != 0, nlines = nlines - 1, bVar6) {
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                (__return_storage_ptr__,strIn);
      strIn = strIn + 1;
    }
  }
  else {
    __p = (pointer)operator_new(0x18);
    p_Var1 = local_40;
    (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    len = 0;
    std::
    __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::reset(local_40,__p);
    std::
    unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)&len);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((p_Var1->_M_t).
               super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
               ._M_head_impl,nlines + 0x40);
    local_38 = sampleBuf + 0x4000;
    uVar3 = 0x30f54513209e49;
    while (sampleBuf < local_38) {
      uVar3 = uVar3 * 0xb11924e1 >> 0xf ^ uVar3 * 0xb11924e1;
      uVar4 = uVar3 % nlines;
      while (sVar2 = lenIn[uVar4], sVar2 == 0) {
        uVar4 = uVar4 + 1;
        if (uVar4 == nlines) {
          uVar4 = 0;
        }
      }
      uVar3 = uVar3 * 0xb11924e1;
      uVar3 = uVar3 >> 0xf ^ uVar3;
      uVar5 = uVar3 % ((sVar2 - 1 >> 9) + 1);
      len = sVar2 + uVar5 * -0x200;
      if (0x1ff < len) {
        len = 0x200;
      }
      switchD_016b0717::default(sampleBuf,strIn[uVar4] + uVar5 * 0x200,len);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                (__return_storage_ptr__,&sampleBuf_local);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((local_40->_M_t).
                 super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
                 ._M_head_impl,&len);
      sampleBuf = sampleBuf_local + len;
      sampleBuf_local = sampleBuf;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<u8*> makeSample(u8* sampleBuf, u8* strIn[], size_t *lenIn, size_t nlines,
                                                    unique_ptr<vector<size_t>>& sample_len_out) {
	size_t totSize = 0;
	vector<u8*> sample;

	for(size_t i=0; i<nlines; i++)
		totSize += lenIn[i];
	if (totSize < FSST_SAMPLETARGET) {
		for(size_t i=0; i<nlines; i++)
			sample.push_back(strIn[i]);
	} else {
		size_t sampleRnd = FSST_HASH(4637947);
		u8* sampleLim = sampleBuf + FSST_SAMPLETARGET;

		sample_len_out = unique_ptr<vector<size_t>>(new vector<size_t>());
		sample_len_out->reserve(nlines + FSST_SAMPLEMAXSZ/FSST_SAMPLELINE);

		// This fails if we have a lot of small strings and a few big ones?
		while(sampleBuf < sampleLim) {
			// choose a non-empty line
			sampleRnd = FSST_HASH(sampleRnd);
			size_t linenr = sampleRnd % nlines;
			while (lenIn[linenr] == 0)
				if (++linenr == nlines) linenr = 0;

			// choose a chunk
			size_t chunks = 1 + ((lenIn[linenr]-1) / FSST_SAMPLELINE);
			sampleRnd = FSST_HASH(sampleRnd);
			size_t chunk = FSST_SAMPLELINE*(sampleRnd % chunks);

			// add the chunk to the sample
			size_t len = min(lenIn[linenr]-chunk,FSST_SAMPLELINE);
			memcpy(sampleBuf, strIn[linenr]+chunk, len);
			sample.push_back(sampleBuf);

			sample_len_out->push_back(len);
			sampleBuf += len;
		}
	}
	return sample;
}